

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

InnerProductLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::InnerProductLayerParams>
          (Arena *arena)

{
  InnerProductLayerParams *pIVar1;
  
  if (arena != (Arena *)0x0) {
    pIVar1 = DoCreateMessage<CoreML::Specification::InnerProductLayerParams>(arena);
    return pIVar1;
  }
  pIVar1 = (InnerProductLayerParams *)operator_new(0x38);
  CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(pIVar1,(Arena *)0x0,false)
  ;
  return pIVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }